

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O2

void __thiscall
chrono::ChProximityContainerSPH::ChProximityContainerSPH(ChProximityContainerSPH *this)

{
  list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_> *plVar1;
  
  ChProximityContainer::ChProximityContainer(&this->super_ChProximityContainer);
  plVar1 = &this->proximitylist;
  (this->super_ChProximityContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChProximityContainerSPH_0115c328;
  (this->proximitylist).
  super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->proximitylist).
  super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  this->n_added = 0;
  (this->proximitylist).
  super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->lastproximity)._M_node = (_List_node_base *)0x0;
  (this->lastproximity)._M_node = (_List_node_base *)plVar1;
  return;
}

Assistant:

ChProximityContainerSPH::ChProximityContainerSPH() : n_added(0) {
    lastproximity = proximitylist.begin();
}